

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_internal.cpp
# Opt level: O0

void cfd::TransactionContextUtil::Verify<cfd::ConfidentialTransactionContext>
               (ConfidentialTransactionContext *transaction,OutPoint *outpoint,UtxoData *utxo,
               AbstractTxIn *txin,
               function<cfd::core::ByteData256_(const_cfd::ConfidentialTransactionContext_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*)>
               *create_sighash_func)

{
  ByteData BVar1;
  int iVar2;
  bool bVar3;
  byte bVar4;
  size_type sVar5;
  undefined8 uVar6;
  SigHashType *pSVar7;
  reference pvVar8;
  Pubkey *__args_4;
  ConfidentialTransactionContext *pCVar9;
  ulong uVar10;
  function<cfd::core::ByteData256_(const_cfd::ConfidentialTransactionContext_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*)>
  *in_RDI;
  value_type *pubkey_1;
  size_t key_index;
  ByteData256 sighash_2;
  ByteData signature_1;
  bool is_exist;
  size_t index;
  int prev_key_index;
  SigHashType sighashtype_1;
  string fail_indexes;
  uint32_t success_count;
  vector<cfd::core::SigHashType,_std::allocator<cfd::core::SigHashType>_> sighashtype_list;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> signatures;
  uint32_t sig_size;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> pubkeys;
  uint32_t req_num;
  Script redeem_script;
  bool is_verify_1;
  ByteData256 sighash_1;
  Pubkey pubkey;
  ByteData signature;
  SigHashType sighashtype;
  bool is_verify;
  ByteData256 sighash;
  ByteData annex;
  Script tapscript;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> nodes;
  SchnorrPubkey internal_pubkey;
  uint8_t leaf_version;
  bool has_parity;
  SchnorrSignature schnorr_sig;
  SchnorrPubkey witness_program;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> signature_stack;
  WitnessVersion version;
  bool has_pubkey;
  Script script;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> items;
  UtxoData work_utxo;
  ByteData *in_stack_fffffffffffff3b8;
  UtxoData *in_stack_fffffffffffff3c0;
  undefined4 in_stack_fffffffffffff3c8;
  undefined4 in_stack_fffffffffffff3cc;
  string *in_stack_fffffffffffff3d0;
  size_type in_stack_fffffffffffff3d8;
  CfdError CVar11;
  CfdException *in_stack_fffffffffffff3e0;
  SigHashType *in_stack_fffffffffffff3f0;
  UtxoData *in_stack_fffffffffffff3f8;
  allocator *paVar12;
  undefined7 in_stack_fffffffffffff400;
  byte in_stack_fffffffffffff407;
  ConfidentialTransactionContext *in_stack_fffffffffffff408;
  function<cfd::core::ByteData256_(const_cfd::ConfidentialTransactionContext_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*)>
  *in_stack_fffffffffffff410;
  function<cfd::core::ByteData256_(const_cfd::ConfidentialTransactionContext_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*)>
  *this;
  UtxoData *in_stack_fffffffffffff428;
  UtxoData *in_stack_fffffffffffff430;
  Pubkey *in_stack_fffffffffffff440;
  Script *in_stack_fffffffffffff448;
  Script *__args_5;
  WitnessVersion __args_6;
  undefined8 in_stack_fffffffffffff450;
  ByteData *in_stack_fffffffffffff458;
  undefined7 in_stack_fffffffffffff460;
  byte in_stack_fffffffffffff467;
  AbstractTxIn *in_stack_fffffffffffff4a0;
  undefined7 in_stack_fffffffffffff4a8;
  undefined1 in_stack_fffffffffffff4af;
  string local_ad0 [38];
  undefined1 local_aaa;
  allocator local_aa9;
  string local_aa8 [32];
  reference local_a88;
  ConfidentialTransactionContext *local_a80;
  Pubkey local_a78;
  ByteData256 local_a60;
  ByteData local_a48;
  byte local_a29;
  ulong local_a28;
  int local_a20;
  SigHashType local_a1c [12];
  string local_a10 [32];
  uint local_9f0;
  undefined1 local_9ea;
  allocator local_9e9;
  string local_9e8 [71];
  undefined1 local_9a1 [33];
  undefined1 local_980 [32];
  string local_960 [38];
  undefined1 local_93a;
  allocator local_939;
  string local_938 [32];
  string local_918 [38];
  undefined1 local_8f2;
  allocator local_8f1;
  string local_8f0 [32];
  undefined1 local_8d0 [64];
  string local_890 [39];
  byte local_869;
  undefined1 local_868 [166];
  undefined1 local_7c2;
  allocator local_7c1;
  string local_7c0 [38];
  undefined1 local_79a;
  allocator local_799;
  string local_798 [39];
  byte local_771;
  Script local_770;
  Pubkey local_738 [2];
  ByteData local_6f8;
  Script local_6e0;
  vector local_6a8 [24];
  SchnorrPubkey local_690 [30];
  uchar local_672;
  bool local_671;
  ByteData256 local_670;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> local_648;
  ByteData local_630;
  SchnorrPubkey local_618 [24];
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_600;
  int local_5e8;
  byte local_5e1;
  ByteData local_5e0;
  Script local_5c8 [2];
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> local_530 [23];
  _func_int **in_stack_fffffffffffffd00;
  WitnessVersion *in_stack_fffffffffffffd08;
  AbstractTxIn *in_stack_fffffffffffffd10;
  UtxoData *in_stack_fffffffffffffd18;
  int local_2b0;
  
  bVar3 = IsOpTrueLockingScript
                    ((UtxoData *)CONCAT17(in_stack_fffffffffffff4af,in_stack_fffffffffffff4a8),
                     in_stack_fffffffffffff4a0);
  if (!bVar3) {
    UtxoData::UtxoData(in_stack_fffffffffffff430,in_stack_fffffffffffff428);
    if (local_2b0 == 1) {
      std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::vector
                ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
                 0x3a67c7);
      cfd::core::AbstractTxIn::GetUnlockingScript();
      cfd::core::Script::GetElementList();
      std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::operator=
                ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
                 in_stack_fffffffffffff3d0,
                 (vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
                 CONCAT44(in_stack_fffffffffffff3cc,in_stack_fffffffffffff3c8));
      std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
                ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
                 in_stack_fffffffffffff3d0);
      core::Script::~Script((Script *)in_stack_fffffffffffff3c0);
      sVar5 = std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::size
                        (local_530);
      if (sVar5 == 1) {
        std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::operator[]
                  (local_530,0);
        cfd::core::ScriptElement::GetBinaryData();
        cfd::core::Script::Script(local_5c8,&local_5e0);
        core::ByteData::~ByteData((ByteData *)0x3a6882);
        bVar4 = cfd::core::Script::IsP2wpkhScript();
        if ((bVar4 & 1) == 0) {
          bVar4 = cfd::core::Script::IsP2wshScript();
          if ((bVar4 & 1) != 0) {
            local_2b0 = 5;
          }
        }
        else {
          local_2b0 = 6;
        }
        core::Script::~Script((Script *)in_stack_fffffffffffff3c0);
      }
      std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
                ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
                 in_stack_fffffffffffff3d0);
    }
    local_5e1 = 0;
    local_5e8 = -1;
    GetVerifySignatureStack
              (in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,
               (bool *)in_stack_fffffffffffffd00);
    __args_6 = (WitnessVersion)in_stack_fffffffffffff450;
    if (local_5e8 == 1) {
      cfd::core::Script::GetElementList();
      CVar11 = (CfdError)(in_stack_fffffffffffff3d8 >> 0x20);
      std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::operator[]
                (&local_648,1);
      cfd::core::ScriptElement::GetBinaryData();
      cfd::core::SchnorrPubkey::SchnorrPubkey(local_618,&local_630);
      core::ByteData::~ByteData((ByteData *)0x3a6a4e);
      std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
                ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
                 in_stack_fffffffffffff3d0);
      cfd::core::SchnorrSignature::SchnorrSignature((SchnorrSignature *)&local_670);
      local_671 = false;
      local_672 = '\0';
      cfd::core::SchnorrPubkey::SchnorrPubkey(local_690);
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::vector
                ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)0x3a6a96
                );
      cfd::core::Script::Script(&local_6e0);
      cfd::core::ByteData::ByteData(&local_6f8);
      cfd::core::TaprootUtil::ParseTaprootSignData
                ((vector *)&local_600,(SchnorrSignature *)&local_670,&local_671,&local_672,local_690
                 ,local_6a8,&local_6e0,(vector *)0x0,&local_6f8);
      if ((local_5e1 & 1) == 0) {
        cfd::core::TaprootUtil::VerifyTaprootCommitment
                  ((bool)(local_671 & 1),local_672,local_618,local_690,local_6a8,&local_6e0,
                   (ByteData256 *)0x0);
        local_7c2 = 1;
        uVar6 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_7c0,"The script analysis of tapscript is not supported.",&local_7c1);
        core::CfdException::CfdException(in_stack_fffffffffffff3e0,CVar11,in_stack_fffffffffffff3d0)
        ;
        local_7c2 = 0;
        __cxa_throw(uVar6,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      cfd::core::SchnorrSignature::GetSigHashType();
      cfd::core::Pubkey::Pubkey(local_738);
      cfd::core::Script::Script(&local_770);
      in_stack_fffffffffffff3d0 = (string *)&local_6f8;
      in_stack_fffffffffffff3c0 = (UtxoData *)&local_770;
      CVar11 = kCfdSuccess;
      std::
      function<cfd::core::ByteData256_(const_cfd::ConfidentialTransactionContext_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*)>
      ::operator()(in_stack_fffffffffffff410,in_stack_fffffffffffff408,
                   (OutPoint *)CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
                   in_stack_fffffffffffff3f8,in_stack_fffffffffffff3f0,in_stack_fffffffffffff440,
                   in_stack_fffffffffffff448,__args_6,in_stack_fffffffffffff458,
                   (TaprootScriptTree *)
                   CONCAT17(in_stack_fffffffffffff467,in_stack_fffffffffffff460));
      core::Script::~Script((Script *)in_stack_fffffffffffff3c0);
      core::Pubkey::~Pubkey((Pubkey *)0x3a6bf9);
      local_771 = cfd::core::SchnorrPubkey::Verify((SchnorrSignature *)local_618,&local_670);
      local_771 = local_771 & 1;
      if (local_771 == 0) {
        local_79a = 1;
        uVar6 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_798,"Verify signature fail.",&local_799);
        core::CfdException::CfdException(in_stack_fffffffffffff3e0,CVar11,in_stack_fffffffffffff3d0)
        ;
        local_79a = 0;
        __cxa_throw(uVar6,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      core::ByteData256::~ByteData256((ByteData256 *)0x3a6e91);
      core::ByteData::~ByteData((ByteData *)0x3a6fe9);
      core::Script::~Script((Script *)in_stack_fffffffffffff3c0);
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                 in_stack_fffffffffffff3d0);
      core::SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)0x3a7010);
      core::SchnorrSignature::~SchnorrSignature((SchnorrSignature *)0x3a701d);
      core::SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)0x3a702a);
    }
    else if ((local_5e1 & 1) == 0) {
      pvVar8 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::back
                         ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                          in_stack_fffffffffffff3c0);
      cfd::core::Script::Script((Script *)local_8d0,pvVar8);
      bVar4 = cfd::core::Script::IsMultisigScript();
      if ((bVar4 & 1) == 0) {
        local_8f2 = 1;
        uVar6 = __cxa_allocate_exception(0x30);
        CVar11 = (CfdError)(in_stack_fffffffffffff3d8 >> 0x20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_8f0,"Unsupported script format. verify support is multisig only.",
                   &local_8f1);
        core::CfdException::CfdException(in_stack_fffffffffffff3e0,CVar11,in_stack_fffffffffffff3d0)
        ;
        local_8f2 = 0;
        __cxa_throw(uVar6,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      if (local_2b0 == 1) {
        std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                  (&local_600,0);
        cfd::core::ByteData::GetHex_abi_cxx11_();
        bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffff3c0,(char *)in_stack_fffffffffffff3b8);
        std::__cxx11::string::~string(local_918);
        if (bVar3) {
          local_93a = 1;
          uVar6 = __cxa_allocate_exception(0x30);
          CVar11 = (CfdError)(in_stack_fffffffffffff3d8 >> 0x20);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_938,"Invalid multisig format. top stack is OP_0 only.",&local_939);
          core::CfdException::CfdException
                    (in_stack_fffffffffffff3e0,CVar11,in_stack_fffffffffffff3d0);
          local_93a = 0;
          __cxa_throw(uVar6,&core::CfdException::typeinfo,core::CfdException::~CfdException);
        }
      }
      else {
        std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                  (&local_600,0);
        in_stack_fffffffffffff467 = cfd::core::ByteData::IsEmpty();
        if ((in_stack_fffffffffffff467 & 1) == 0) {
          local_980[0x1e] = 1;
          uVar6 = __cxa_allocate_exception(0x30);
          CVar11 = (CfdError)(in_stack_fffffffffffff3d8 >> 0x20);
          paVar12 = (allocator *)(local_980 + 0x1f);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_960,"Invalid multisig format. top byte is empty only.",paVar12);
          core::CfdException::CfdException
                    (in_stack_fffffffffffff3e0,CVar11,in_stack_fffffffffffff3d0);
          local_980[0x1e] = 0;
          __cxa_throw(uVar6,&core::CfdException::typeinfo,core::CfdException::~CfdException);
        }
      }
      local_980._24_4_ = 0;
      cfd::core::ScriptUtil::ExtractPubkeysFromMultisigScript((Script *)local_980,(uint *)local_8d0)
      ;
      sVar5 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                        (&local_600);
      local_9a1._29_4_ = (int)sVar5 - 2;
      __args_4 = (Pubkey *)(ulong)(uint)local_9a1._29_4_;
      __args_5 = (Script *)local_9a1;
      std::allocator<cfd::core::ByteData>::allocator((allocator<cfd::core::ByteData> *)0x3a7844);
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
                ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                 in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,
                 (allocator_type *)in_stack_fffffffffffff3d0);
      std::allocator<cfd::core::ByteData>::~allocator((allocator<cfd::core::ByteData> *)0x3a7870);
      std::allocator<cfd::core::SigHashType>::allocator
                ((allocator<cfd::core::SigHashType> *)0x3a7891);
      std::vector<cfd::core::SigHashType,_std::allocator<cfd::core::SigHashType>_>::vector
                ((vector<cfd::core::SigHashType,_std::allocator<cfd::core::SigHashType>_> *)
                 in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,
                 (allocator_type *)in_stack_fffffffffffff3d0);
      std::allocator<cfd::core::SigHashType>::~allocator
                ((allocator<cfd::core::SigHashType> *)0x3a78ba);
      CVar11 = (CfdError)(in_stack_fffffffffffff3d8 >> 0x20);
      if ((uint)local_9a1._29_4_ < (uint)local_980._24_4_) {
        local_9ea = 1;
        uVar6 = __cxa_allocate_exception(0x30);
        paVar12 = &local_9e9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_9e8,"Signature count is less than multisig require count.",paVar12);
        core::CfdException::CfdException(in_stack_fffffffffffff3e0,CVar11,in_stack_fffffffffffff3d0)
        ;
        local_9ea = 0;
        __cxa_throw(uVar6,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      local_9f0 = 0;
      std::__cxx11::string::string(local_a10);
      cfd::core::SigHashType::SigHashType(local_a1c);
      local_a20 = -1;
      for (local_a28 = 0; CVar11 = (CfdError)(in_stack_fffffffffffff3d8 >> 0x20),
          local_a28 < (uint)local_9a1._29_4_; local_a28 = local_a28 + 1) {
        local_a29 = 0;
        pSVar7 = (SigHashType *)
                 std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                           (&local_600,local_a28 + 1);
        cfd::core::CryptoUtil::ConvertSignatureFromDer(&local_a48,pSVar7);
        this = in_RDI;
        cfd::core::Pubkey::Pubkey(&local_a78);
        in_stack_fffffffffffff3c0 = (UtxoData *)local_8d0;
        in_stack_fffffffffffff3d8 = 0;
        in_stack_fffffffffffff3d0 = (string *)0x0;
        std::
        function<cfd::core::ByteData256_(const_cfd::ConfidentialTransactionContext_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*)>
        ::operator()(this,in_stack_fffffffffffff408,
                     (OutPoint *)CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
                     in_stack_fffffffffffff3f8,in_stack_fffffffffffff3f0,__args_4,__args_5,
                     (WitnessVersion)in_stack_fffffffffffff450,in_stack_fffffffffffff458,
                     (TaprootScriptTree *)
                     CONCAT17(in_stack_fffffffffffff467,in_stack_fffffffffffff460));
        core::Pubkey::~Pubkey((Pubkey *)0x3a7b26);
        local_a80 = (ConfidentialTransactionContext *)0x0;
        while (in_stack_fffffffffffff408 = local_a80,
              pCVar9 = (ConfidentialTransactionContext *)
                       std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::size
                                 ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)
                                  local_980), iVar2 = local_a20, in_stack_fffffffffffff408 < pCVar9)
        {
          local_a88 = std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::operator[]
                                ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)
                                 local_980,(size_type)local_a80);
          in_stack_fffffffffffff407 =
               cfd::core::SignatureUtil::VerifyEcSignature(&local_a60,local_a88,&local_a48);
          CVar11 = (CfdError)(in_stack_fffffffffffff3d8 >> 0x20);
          local_a29 = in_stack_fffffffffffff407 & 1;
          if (local_a29 != 0) {
            iVar2 = (int)local_a80;
            if ((int)local_a80 <= local_a20) {
              local_aaa = 1;
              uVar6 = __cxa_allocate_exception(0x30);
              paVar12 = &local_aa9;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_aa8,"Signature order is incorrect.",paVar12);
              core::CfdException::CfdException
                        (in_stack_fffffffffffff3e0,CVar11,in_stack_fffffffffffff3d0);
              local_aaa = 0;
              __cxa_throw(uVar6,&core::CfdException::typeinfo,core::CfdException::~CfdException);
            }
            break;
          }
          local_a80 = (ConfidentialTransactionContext *)&local_a80->field_0x1;
        }
        local_a20 = iVar2;
        if ((local_a29 & 1) == 0) {
          uVar10 = std::__cxx11::string::empty();
          if ((uVar10 & 1) == 0) {
            std::__cxx11::string::operator+=(local_a10,",");
          }
          std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffff3f8);
          std::__cxx11::string::operator+=(local_a10,local_ad0);
          std::__cxx11::string::~string(local_ad0);
        }
        else {
          local_9f0 = local_9f0 + 1;
        }
        core::ByteData256::~ByteData256((ByteData256 *)0x3a7e03);
        core::ByteData::~ByteData((ByteData *)0x3a7e10);
      }
      if (local_9f0 != local_9a1._29_4_) {
        uVar6 = __cxa_allocate_exception(0x30);
        std::operator+((char *)in_stack_fffffffffffff408,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400));
        core::CfdException::CfdException(in_stack_fffffffffffff3e0,CVar11,in_stack_fffffffffffff3d0)
        ;
        __cxa_throw(uVar6,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      std::__cxx11::string::~string(local_a10);
      std::vector<cfd::core::SigHashType,_std::allocator<cfd::core::SigHashType>_>::~vector
                ((vector<cfd::core::SigHashType,_std::allocator<cfd::core::SigHashType>_> *)
                 in_stack_fffffffffffff3d0);
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                 in_stack_fffffffffffff3d0);
      std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
                ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)
                 in_stack_fffffffffffff3d0);
      core::Script::~Script((Script *)in_stack_fffffffffffff3c0);
    }
    else {
      cfd::core::SigHashType::SigHashType((SigHashType *)(local_868 + 0x98));
      pSVar7 = (SigHashType *)
               std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                         (&local_600,0);
      cfd::core::CryptoUtil::ConvertSignatureFromDer((ByteData *)(local_868 + 0x80),pSVar7);
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                (&local_600,1);
      core::ByteData::ByteData((ByteData *)in_stack_fffffffffffff3c0,in_stack_fffffffffffff3b8);
      BVar1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff3c0;
      BVar1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff3b8;
      BVar1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = in_stack_fffffffffffff3c8;
      BVar1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = in_stack_fffffffffffff3cc;
      cfd::core::Pubkey::Pubkey((Pubkey *)(local_868 + 0x68),BVar1);
      core::ByteData::~ByteData((ByteData *)0x3a7112);
      cfd::core::Script::Script((Script *)local_868);
      in_stack_fffffffffffff3c0 = (UtxoData *)local_868;
      CVar11 = kCfdSuccess;
      in_stack_fffffffffffff3d0 = (string *)0x0;
      std::
      function<cfd::core::ByteData256_(const_cfd::ConfidentialTransactionContext_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*)>
      ::operator()(in_stack_fffffffffffff410,in_stack_fffffffffffff408,
                   (OutPoint *)CONCAT17(in_stack_fffffffffffff407,in_stack_fffffffffffff400),
                   in_stack_fffffffffffff3f8,in_stack_fffffffffffff3f0,in_stack_fffffffffffff440,
                   in_stack_fffffffffffff448,__args_6,in_stack_fffffffffffff458,
                   (TaprootScriptTree *)
                   CONCAT17(in_stack_fffffffffffff467,in_stack_fffffffffffff460));
      core::Script::~Script((Script *)in_stack_fffffffffffff3c0);
      local_869 = cfd::core::SignatureUtil::VerifyEcSignature
                            ((ByteData256 *)(local_868 + 0x38),(Pubkey *)(local_868 + 0x68),
                             (ByteData *)(local_868 + 0x80));
      local_869 = local_869 & 1;
      if (local_869 == 0) {
        local_8d0[0x3e] = 1;
        uVar6 = __cxa_allocate_exception(0x30);
        paVar12 = (allocator *)(local_8d0 + 0x3f);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_890,"Verify signature fail.",paVar12);
        core::CfdException::CfdException(in_stack_fffffffffffff3e0,CVar11,in_stack_fffffffffffff3d0)
        ;
        local_8d0[0x3e] = 0;
        __cxa_throw(uVar6,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      core::ByteData256::~ByteData256((ByteData256 *)0x3a7391);
      core::Pubkey::~Pubkey((Pubkey *)0x3a739e);
      core::ByteData::~ByteData((ByteData *)0x3a73ab);
    }
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
              ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
               in_stack_fffffffffffff3d0);
    UtxoData::~UtxoData(in_stack_fffffffffffff3c0);
  }
  return;
}

Assistant:

void TransactionContextUtil::Verify(
    const Tx* transaction, const OutPoint& outpoint, const UtxoData& utxo,
    const AbstractTxIn* txin,
    std::function<ByteData256(
        const Tx*, const OutPoint&, const UtxoData&, const SigHashType&,
        const Pubkey&, const Script&, WitnessVersion, const ByteData*,
        const TaprootScriptTree*)>
        create_sighash_func) {
  if (TransactionContextUtil::IsOpTrueLockingScript(utxo, txin)) {
    return;  // OP_TRUE only.
  }

  // Correspondence when addressType is extracted from address string.
  UtxoData work_utxo = utxo;
  if (work_utxo.address_type == AddressType::kP2shAddress) {
    std::vector<ScriptElement> items;
    items = txin->GetUnlockingScript().GetElementList();
    if (items.size() == 1) {
      Script script = Script(items[0].GetBinaryData());
      if (script.IsP2wpkhScript()) {
        work_utxo.address_type = AddressType::kP2shP2wpkhAddress;
      } else if (script.IsP2wshScript()) {
        work_utxo.address_type = AddressType::kP2shP2wshAddress;
      }
    }
  }

  bool has_pubkey = false;
  WitnessVersion version = WitnessVersion::kVersionNone;
  std::vector<ByteData> signature_stack =
      TransactionContextUtil::GetVerifySignatureStack(
          work_utxo, txin, &version, &has_pubkey);

  if (version == WitnessVersion::kVersion1) {
    SchnorrPubkey witness_program(
        utxo.locking_script.GetElementList()[1].GetBinaryData());
    SchnorrSignature schnorr_sig;
    bool has_parity = false;
    uint8_t leaf_version = 0;
    SchnorrPubkey internal_pubkey;
    std::vector<ByteData256> nodes;
    Script tapscript;
    ByteData annex;
    TaprootUtil::ParseTaprootSignData(
        signature_stack, &schnorr_sig, &has_parity, &leaf_version,
        &internal_pubkey, &nodes, &tapscript, nullptr, &annex);
    if (has_pubkey) {
      auto sighash = create_sighash_func(
          transaction, outpoint, work_utxo, schnorr_sig.GetSigHashType(),
          Pubkey(), Script(), version, &annex, nullptr);
      bool is_verify = witness_program.Verify(schnorr_sig, sighash);
      if (!is_verify) {
        throw CfdException(
            CfdError::kCfdIllegalStateError, "Verify signature fail.");
      }
    } else {
      TaprootUtil::VerifyTaprootCommitment(
          has_parity, leaf_version, witness_program, internal_pubkey, nodes,
          tapscript);
      // At the moment, there is no function to run Script,
      // so no further confirmation is possible.
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "The script analysis of tapscript is not supported.");
    }
  } else if (has_pubkey) {
    SigHashType sighashtype;
    ByteData signature =
        CryptoUtil::ConvertSignatureFromDer(signature_stack[0], &sighashtype);
    Pubkey pubkey(signature_stack[1]);
    auto sighash = create_sighash_func(
        transaction, outpoint, work_utxo, sighashtype, pubkey, Script(),
        version, nullptr, nullptr);
    bool is_verify =
        SignatureUtil::VerifyEcSignature(sighash, pubkey, signature);
    if (!is_verify) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Verify signature fail.");
    }
  } else {
    // check script format
    Script redeem_script(signature_stack.back());
    if (!redeem_script.IsMultisigScript()) {
      // At the moment, there is no function to run Script,
      // so no further confirmation is possible.
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Unsupported script format. verify support is multisig only.");
    }
    if (work_utxo.address_type == AddressType::kP2shAddress) {
      if (signature_stack[0].GetHex() != "00") {
        throw CfdException(
            CfdError::kCfdIllegalStateError,
            "Invalid multisig format. top stack is OP_0 only.");
      }
    } else {
      if (!signature_stack[0].IsEmpty()) {
        throw CfdException(
            CfdError::kCfdIllegalStateError,
            "Invalid multisig format. top byte is empty only.");
      }
    }
    uint32_t req_num = 0;
    std::vector<Pubkey> pubkeys =
        ScriptUtil::ExtractPubkeysFromMultisigScript(redeem_script, &req_num);

    uint32_t sig_size = static_cast<uint32_t>(signature_stack.size()) - 2;
    std::vector<ByteData> signatures(sig_size);
    std::vector<SigHashType> sighashtype_list(sig_size);
    if (sig_size < req_num) {
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Signature count is less than multisig require count.");
    }

    uint32_t success_count = 0;
    std::string fail_indexes;
    SigHashType sighashtype;
    int prev_key_index = -1;
    for (size_t index = 0; index < sig_size; ++index) {
      bool is_exist = false;
      auto signature = CryptoUtil::ConvertSignatureFromDer(
          signature_stack[index + 1], &sighashtype);
      auto sighash = create_sighash_func(
          transaction, outpoint, work_utxo, sighashtype, Pubkey(),
          redeem_script, version, nullptr, nullptr);
      for (size_t key_index = 0; key_index < pubkeys.size(); ++key_index) {
        const auto& pubkey = pubkeys[key_index];
        is_exist =
            SignatureUtil::VerifyEcSignature(sighash, pubkey, signature);
        if (is_exist) {
          if (prev_key_index >= static_cast<int>(key_index)) {
            throw CfdException(
                CfdError::kCfdIllegalStateError,
                "Signature order is incorrect.");
          }
          prev_key_index = static_cast<int>(key_index);
          break;
        }
      }
      if (is_exist) {
        ++success_count;
      } else {
        if (!fail_indexes.empty()) fail_indexes += ",";
        fail_indexes += std::to_string(index);
      }
    }

    if (success_count != sig_size) {
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Verify signature fail. fail index = " + fail_indexes);
    }
  }
}